

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int AnalyzeExpressScanDataResponseRPLIDAR
              (uchar *buf,int buflen,int nb_bytes_response,int *pnbBytesToRequest,
              int *pnbBytesToDiscard)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  uchar ChkSum;
  uchar sync;
  int *pnbBytesToDiscard_local;
  int *pnbBytesToRequest_local;
  int nb_bytes_response_local;
  int buflen_local;
  uchar *buf_local;
  
  *pnbBytesToRequest = -1;
  *pnbBytesToDiscard = 0;
  if (buflen < nb_bytes_response) {
    *pnbBytesToRequest = nb_bytes_response - buflen;
    buf_local._4_4_ = 6;
  }
  else if ((byte)(*buf & 0xf0 | (byte)((int)(uint)buf[1] >> 4)) == 0xa5) {
    uVar1 = buf[1];
    bVar2 = *buf;
    bVar3 = ComputeChecksumRPLIDAR(buf + 2,nb_bytes_response + -1);
    if ((byte)(uVar1 << 4 | bVar2 & 0xf) == bVar3) {
      buf_local._4_4_ = 0;
    }
    else {
      printf("Warning : RPLIDAR bad ChkSum. \n");
      *pnbBytesToDiscard = 1;
      buf_local._4_4_ = 1;
    }
  }
  else {
    printf("Warning : RPLIDAR bad sync1 or sync2. \n");
    *pnbBytesToDiscard = 1;
    buf_local._4_4_ = 1;
  }
  return buf_local._4_4_;
}

Assistant:

inline int AnalyzeExpressScanDataResponseRPLIDAR(unsigned char* buf, int buflen, int nb_bytes_response,
	int* pnbBytesToRequest, int* pnbBytesToDiscard)
{
	unsigned char sync = 0, ChkSum = 0;

	*pnbBytesToRequest = -1;
	*pnbBytesToDiscard = 0;
	if (buflen < nb_bytes_response)
	{
		*pnbBytesToRequest = nb_bytes_response-buflen;
		return EXIT_OUT_OF_MEMORY;
	}
	sync = (buf[0] & 0xF0)|(buf[1] >> 4);
	if (sync != START_FLAG1_RPLIDAR)
	{
		printf("Warning : RPLIDAR bad sync1 or sync2. \n");
		*pnbBytesToDiscard = 1; // We are only sure that the first byte can be discarded...
		return EXIT_FAILURE;
	}
	ChkSum = (buf[1] << 4)|(buf[0] & 0x0F);
	// Force ComputeChecksumRPLIDAR() to compute until the last byte...
	if (ChkSum != ComputeChecksumRPLIDAR(buf+2, nb_bytes_response-1))
	{
		printf("Warning : RPLIDAR bad ChkSum. \n");
		*pnbBytesToDiscard = 1; // We are only sure that the first byte can be discarded...
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}